

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_true>::AtQuantifier
          (Parser<UTF8EncodingPolicyBase<false>,_true> *this)

{
  StandardChars<unsigned_char> *pSVar1;
  CharCount CVar2;
  int iVar3;
  byte bVar4;
  EncodedChar EVar5;
  bool bVar6;
  int iVar7;
  ulong uVar8;
  
  bVar4 = ECLookahead(this,0);
  if (bVar4 - 0x2a < 2) {
    return true;
  }
  if (bVar4 == 0x3f) {
    return true;
  }
  if (bVar4 == 0x7b) {
    uVar8 = 1;
    do {
      CVar2 = (CharCount)uVar8;
      uVar8 = (ulong)(CVar2 + 1);
      if (this->inputLim < this->next + uVar8) break;
      pSVar1 = this->standardEncodedChars;
      EVar5 = ECLookahead(this,CVar2);
      bVar6 = StandardChars<unsigned_char>::IsDigit(pSVar1,EVar5);
    } while (bVar6);
    if ((CVar2 != 1) && (this->next + uVar8 <= this->inputLim)) {
      EVar5 = ECLookahead(this,CVar2);
      if (EVar5 == '}') {
        return true;
      }
      if (EVar5 == ',') {
        uVar8 = (ulong)(CVar2 + 1);
        if ((this->next + (CVar2 + 2) <= this->inputLim) &&
           (EVar5 = ECLookahead(this,CVar2 + 1), EVar5 == '}')) {
          return true;
        }
        iVar3 = 0;
        do {
          iVar7 = iVar3;
          CVar2 = (CharCount)uVar8;
          uVar8 = (ulong)(CVar2 + 1);
          if (this->inputLim < this->next + uVar8) break;
          pSVar1 = this->standardEncodedChars;
          EVar5 = ECLookahead(this,CVar2);
          bVar6 = StandardChars<unsigned_char>::IsDigit(pSVar1,EVar5);
          iVar3 = iVar7 + -1;
        } while (bVar6);
        if ((iVar7 != 0) && (this->next + uVar8 <= this->inputLim)) {
          EVar5 = ECLookahead(this,CVar2);
          return EVar5 == '}';
        }
      }
    }
  }
  return false;
}

Assistant:

bool Parser<P, IsLiteral>::AtQuantifier()
    {
        // Could be terminating 0
        switch (ECLookahead())
        {
        case '*':
        case '+':
        case '?':
            return true;
        case '{':
            {
                CharCount lookahead = 1;
                while (ECCanConsume(lookahead + 1) && standardEncodedChars->IsDigit(ECLookahead(lookahead)))
                    lookahead++;
                if (lookahead == 1 || !ECCanConsume(lookahead + 1))
                    return false;
                switch (ECLookahead(lookahead))
                {
                case ',':
                    lookahead++;
                    if (ECCanConsume(lookahead + 1) && ECLookahead(lookahead) == '}')
                        return true;
                    else
                    {
                        CharCount saved = lookahead;
                        while (ECCanConsume(lookahead + 1) && standardEncodedChars->IsDigit(ECLookahead(lookahead)))
                            lookahead++;
                        if (lookahead == saved)
                            return false;
                        return ECCanConsume(lookahead + 1) && ECLookahead(lookahead) == '}';
                    }
                case '}':
                    return true;
                default:
                    return false;
                }
            }
        default:
            return false;
        }
    }